

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper_common.cpp
# Opt level: O2

void color_Source(uint32_t *dest,int length,uint32_t color,uint32_t const_alpha)

{
  if (const_alpha == 0xff) {
    memfill32(dest,color,length);
    return;
  }
  copy_helper_sse2(dest,length,
                   (color & 0xff00ff) * const_alpha >> 8 & 0xff00ff |
                   (color >> 8 & 0xff00ff) * const_alpha & 0xff00ff00,0xff - const_alpha);
  return;
}

Assistant:

static void color_Source(uint32_t *dest, int length, uint32_t color,
                         uint32_t alpha)
{
    int ialpha, i;

    if (alpha == 255) {
        memfill32(dest, color, length);
    } else {
        ialpha = 255 - alpha;
        color = BYTE_MUL(color, alpha);
        for (i = 0; i < length; ++i)
            dest[i] = color + BYTE_MUL(dest[i], ialpha);
    }
}